

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O1

ControlledPollAction __thiscall
aeron::archive::RecordingDescriptorPoller::onFragment
          (RecordingDescriptorPoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  int32_t *piVar1;
  ushort uVar2;
  long __args;
  long __args_1;
  long __args_3;
  long __args_4;
  Value VVar3;
  SourcedException *pSVar4;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  uint64_t offset_00;
  allocator local_1b1;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  long local_118;
  long local_110;
  ControlResponse msg;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  MessageHeader hdr;
  
  hdr.m_buffer = (char *)0x0;
  hdr.m_offset = 0;
  offset_00 = (uint64_t)offset;
  io::aeron::archive::codecs::MessageHeader::wrap
            (&hdr,(char *)buffer->m_buffer,offset_00,0,(long)(int)buffer->m_length);
  uVar2 = *(ushort *)(hdr.m_buffer + hdr.m_offset + 2);
  if (uVar2 == 0x16) {
    msg.m_positionPtr = &msg.m_position;
    msg.m_buffer = (char *)buffer->m_buffer;
    msg.m_offset = offset_00 + 8;
    msg.m_actingBlockLength = (uint64_t)*(ushort *)(hdr.m_buffer + hdr.m_offset);
    msg.m_actingVersion = (uint64_t)*(ushort *)(hdr.m_buffer + hdr.m_offset + 6);
    msg.m_bufferLength = (uint64_t)(int)buffer->m_length;
    io::aeron::archive::codecs::RecordingDescriptor::sbePosition
              ((RecordingDescriptor *)&msg,offset_00 + 8 + msg.m_actingBlockLength);
    __args = this->controlSessionId_;
    if ((__args == *(long *)(msg.m_buffer + msg.m_offset)) &&
       (__args_1 = this->correlationId_, __args_1 == *(long *)(msg.m_buffer + msg.m_offset + 8))) {
      local_148 = *(long *)(msg.m_buffer + msg.m_offset + 0x10);
      __args_3 = *(long *)(msg.m_buffer + msg.m_offset + 0x18);
      __args_4 = *(long *)(msg.m_buffer + msg.m_offset + 0x20);
      local_110 = *(long *)(msg.m_buffer + msg.m_offset + 0x28);
      local_118 = *(long *)(msg.m_buffer + msg.m_offset + 0x30);
      local_120 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x38);
      local_128 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x3c);
      local_130 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x40);
      local_138 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x44);
      local_140 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x48);
      local_150 = (ulong)*(uint *)(msg.m_buffer + msg.m_offset + 0x4c);
      io::aeron::archive::codecs::RecordingDescriptor::getStrippedChannelAsString_abi_cxx11_
                (&local_190,(RecordingDescriptor *)&msg);
      io::aeron::archive::codecs::RecordingDescriptor::getOriginalChannelAsString_abi_cxx11_
                (&local_1b0,(RecordingDescriptor *)&msg);
      io::aeron::archive::codecs::RecordingDescriptor::getSourceIdentityAsString_abi_cxx11_
                (&local_170,(RecordingDescriptor *)&msg);
      std::
      function<void_(long,_long,_long,_long,_long,_long,_long,_int,_int,_int,_int,_int,_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->consumer_,__args,__args_1,local_148,__args_3,__args_4,local_110,local_118,
                   (int)local_120,(int)local_128,(int)local_130,(int)local_138,(int)local_140,
                   (int)local_150,&local_190,&local_1b0,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      piVar1 = &this->remainingRecordCount_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) goto LAB_0013d49a;
    }
  }
  else {
    if (uVar2 != 1) {
      pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_190,(uint)uVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     "unknown template id: ",&local_190);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,
                 "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,"");
      pcVar6 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                         );
      std::__cxx11::string::string((string *)&local_170,pcVar6,(allocator *)&local_b0);
      aeron::util::SourcedException::SourcedException
                (pSVar4,(string *)&msg,&local_1b0,&local_170,0x62);
      *(undefined ***)pSVar4 = &PTR__SourcedException_00163228;
      __cxa_throw(pSVar4,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    msg.m_positionPtr = &msg.m_position;
    msg.m_buffer = (char *)buffer->m_buffer;
    msg.m_offset = offset_00 + 8;
    msg.m_actingBlockLength = (uint64_t)*(ushort *)(hdr.m_buffer + hdr.m_offset);
    msg.m_actingVersion = (uint64_t)*(ushort *)(hdr.m_buffer + hdr.m_offset + 6);
    msg.m_bufferLength = (uint64_t)(int)buffer->m_length;
    io::aeron::archive::codecs::ControlResponse::sbePosition
              (&msg,offset_00 + 8 + msg.m_actingBlockLength);
    if (this->controlSessionId_ == *(long *)(msg.m_buffer + msg.m_offset)) {
      VVar3 = io::aeron::archive::codecs::ControlResponseCode::get
                        (*(int32_t *)(msg.m_buffer + msg.m_offset + 0x18));
      if ((VVar3 == RECORDING_UNKNOWN) &&
         (this->correlationId_ == *(long *)(msg.m_buffer + msg.m_offset + 8))) {
LAB_0013d49a:
        this->isDispatchComplete_ = true;
        return BREAK;
      }
      if (VVar3 == ERROR) {
        pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_b0,this->correlationId_);
        std::operator+(&local_170,"response for correlationId=",&local_b0);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
        local_1b0._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_1b0._M_dataplus._M_p == psVar7) {
          local_1b0.field_2._M_allocated_capacity = *psVar7;
          local_1b0.field_2._8_8_ = plVar5[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar7;
        }
        local_1b0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                  (&local_70,&msg);
        std::operator+(&local_190,&local_1b0,&local_70);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "ControlledPollAction aeron::archive::RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                   ,"");
        pcVar6 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp"
                           );
        std::__cxx11::string::string((string *)&local_90,pcVar6,&local_1b1);
        aeron::util::SourcedException::SourcedException(pSVar4,&local_190,&local_d0,&local_90,0x4e);
        *(undefined ***)pSVar4 = &PTR__SourcedException_00163228;
        __cxa_throw(pSVar4,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
    }
  }
  return CONTINUE;
}

Assistant:

ControlledPollAction RecordingDescriptorPoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                           util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId()) {
            auto code = msg.code();
            const std::int64_t correlationId = msg.correlationId();

            if (code == codecs::ControlResponseCode::RECORDING_UNKNOWN &&
                correlationId_ == correlationId) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            } else if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException(
                    "response for correlationId=" + std::to_string(correlationId_) +
                    ", error: " + msg.getErrorMessageAsString(), SOURCEINFO);
            }
        }
    } else if (templateId == codecs::RecordingDescriptor::sbeTemplateId()) {
        codecs::RecordingDescriptor msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        if (controlSessionId_ == msg.controlSessionId() && correlationId_ == msg.correlationId()) {
            consumer_(controlSessionId_, correlationId_, msg.recordingId(), msg.startTimestamp(), msg.stopTimestamp(),
                      msg.startPosition(), msg.stopPosition(), msg.initialTermId(), msg.segmentFileLength(),
                      msg.termBufferLength(), msg.mtuLength(), msg.sessionId(), msg.streamId(), msg.getStrippedChannelAsString(),
                      msg.getOriginalChannelAsString(), msg.getSourceIdentityAsString());

            if (--remainingRecordCount_ == 0) {
                isDispatchComplete_ = true;
                return ControlledPollAction::BREAK;
            }
        }
    } else {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    return ControlledPollAction::CONTINUE;
}